

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e2etest.cc
# Opt level: O2

void e2e_multi_kvs_concurrent_wr(void)

{
  fdb_kvs_handle *handle;
  fdb_status fVar1;
  time_t tVar2;
  size_t keylen;
  size_t valuelen;
  uint uVar3;
  char *__format;
  int iVar4;
  ulong uVar5;
  fdb_kvs_handle **ptr_handle;
  long lVar6;
  fdb_file_handle *dbfile;
  fdb_iterator *it;
  fdb_doc *rdoc;
  fdb_kvs_handle *local_298 [9];
  timeval __test_begin;
  fdb_kvs_config kvs_config;
  pthread_t local_228 [8];
  char buf [64];
  void *apvStack_1a8 [8];
  char body [64];
  fdb_config fconfig;
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  memleak_start();
  rdoc = (fdb_doc *)0x0;
  tVar2 = time((time_t *)0x0);
  srand((uint)tVar2);
  rm_storage_fs();
  system("rm -rf  e2edb_main > errorlog.txt");
  fdb_get_default_config();
  fconfig.num_keeping_headers = 10;
  fdb_get_default_kvs_config();
  fconfig.compaction_mode = '\0';
  fdb_open(&dbfile,"e2edb_main",&fconfig);
  ptr_handle = local_298;
  uVar5 = 0;
  while (uVar5 != 8) {
    sprintf(buf,"e2edb_kv%d",uVar5 & 0xffffffff);
    fVar1 = fdb_kvs_open(dbfile,ptr_handle,buf,&kvs_config);
    uVar5 = uVar5 + 1;
    ptr_handle = ptr_handle + 1;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2etest.cc"
              ,0x5cd);
      e2e_multi_kvs_concurrent_wr()::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2etest.cc"
                    ,0x5cd,"void e2e_multi_kvs_concurrent_wr()");
    }
  }
  uVar3 = 0;
  while (uVar3 != 10) {
    uVar5 = 0;
    while (uVar5 != 8) {
      sprintf(buf,"%dkey%d",(ulong)uVar3,uVar5 & 0xffffffff);
      sprintf(body,"commit%d",(ulong)uVar3);
      handle = local_298[uVar5];
      keylen = strlen(buf);
      valuelen = strlen(body);
      fVar1 = fdb_set_kv(handle,buf,keylen,body,valuelen);
      uVar5 = uVar5 + 1;
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2etest.cc"
                ,0x5d6);
        e2e_multi_kvs_concurrent_wr()::__test_pass = 1;
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2etest.cc"
                      ,0x5d6,"void e2e_multi_kvs_concurrent_wr()");
      }
    }
    fVar1 = fdb_commit(dbfile,'\x01');
    uVar3 = uVar3 + 1;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2etest.cc"
              ,0x5d9);
      e2e_multi_kvs_concurrent_wr()::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2etest.cc"
                    ,0x5d9,"void e2e_multi_kvs_concurrent_wr()");
    }
  }
  for (lVar6 = 0; lVar6 != 0x40; lVar6 = lVar6 + 8) {
    pthread_create((pthread_t *)((long)local_228 + lVar6),(pthread_attr_t *)0x0,update_thread,
                   *(void **)((long)local_298 + lVar6));
  }
  lVar6 = 0;
  while (lVar6 != 0x40) {
    pthread_join(*(pthread_t *)((long)local_228 + lVar6),(void **)((long)apvStack_1a8 + lVar6));
    fVar1 = fdb_rollback((fdb_kvs_handle **)((long)local_298 + lVar6),7);
    lVar6 = lVar6 + 8;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2etest.cc"
              ,0x5e5);
      e2e_multi_kvs_concurrent_wr()::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2etest.cc"
                    ,0x5e5,"void e2e_multi_kvs_concurrent_wr()");
    }
  }
  fVar1 = fdb_commit(dbfile,'\x01');
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2etest.cc"
            ,0x5e9);
    e2e_multi_kvs_concurrent_wr()::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2etest.cc"
                  ,0x5e9,"void e2e_multi_kvs_concurrent_wr()");
  }
  lVar6 = 0;
  while( true ) {
    if (lVar6 == 8) {
      fdb_commit(dbfile,'\x01');
      fdb_close(dbfile);
      fdb_shutdown();
      memleak_end();
      system("rm -rf  e2edb_main > errorlog.txt");
      __format = "%s PASSED\n";
      if (e2e_multi_kvs_concurrent_wr()::__test_pass != '\0') {
        __format = "%s FAILED\n";
      }
      fprintf(_stderr,__format,"TEST: e2e multi kvs concurrent wr test");
      return;
    }
    fVar1 = fdb_iterator_init(local_298[lVar6],&it,(void *)0x0,0,(void *)0x0,0,0);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2etest.cc"
              ,0x5ee);
      e2e_multi_kvs_concurrent_wr()::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2etest.cc"
                    ,0x5ee,"void e2e_multi_kvs_concurrent_wr()");
    }
    iVar4 = 7;
    do {
      fVar1 = fdb_iterator_get(it,&rdoc);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2etest.cc"
                ,0x5f2);
        e2e_multi_kvs_concurrent_wr()::__test_pass = 1;
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2etest.cc"
                      ,0x5f2,"void e2e_multi_kvs_concurrent_wr()");
      }
      fdb_doc_free(rdoc);
      rdoc = (fdb_doc *)0x0;
      fVar1 = fdb_iterator_next(it);
      iVar4 = iVar4 + -1;
    } while (fVar1 != FDB_RESULT_ITERATOR_FAIL);
    if (iVar4 != 0) break;
    fdb_iterator_close(it);
    lVar6 = lVar6 + 1;
  }
  fprintf(_stderr,"Test failed: %s %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2etest.cc"
          ,0x5f7);
  e2e_multi_kvs_concurrent_wr()::__test_pass = 1;
  __assert_fail("j==7",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/e2e/e2etest.cc"
                ,0x5f7,"void e2e_multi_kvs_concurrent_wr()");
}

Assistant:

void e2e_multi_kvs_concurrent_wr() {
    TEST_INIT();
    memleak_start();
    int i, j, r;
    int nf = 8;
    char buf[64];
    char body[64];

    thread_t *tid_wr = alca(thread_t, nf);
    void **thread_ret_wr = alca(void *, nf);
    fdb_file_handle *dbfile;
    fdb_kvs_handle **kvs = alca(fdb_kvs_handle*, nf);
    fdb_doc *rdoc = NULL;
    fdb_status status;
    randomize();
    rm_storage_fs();
    r = system(SHELL_DEL" e2edb_main > errorlog.txt");
    fdb_iterator *it;
    (void)r;

    // create dbfile
    fdb_config fconfig = fdb_get_default_config();
    fconfig.num_keeping_headers = 10;
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.compaction_mode  = FDB_COMPACTION_MANUAL;
    fdb_open(&dbfile, "e2edb_main", &fconfig);

    // open dbfiles
    for (i = 0; i < nf; i++) {
        sprintf(buf, "e2edb_kv%d", i);
        status = fdb_kvs_open(dbfile, &kvs[i], buf, &kvs_config);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

    // initial commits
    for (j = 0; j < 10; j++) {
        for (i = 0; i < nf; i++) {
            sprintf(buf, "%dkey%d", j, i);
            sprintf(body, "commit%d", j);
            status = fdb_set_kv(kvs[i], buf, strlen(buf), body, strlen(body));
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        }
        status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

    // run update thread on each file to enter reuse
    for (i = 0; i < nf; i++) {
        thread_create(&tid_wr[i], update_thread, (void*)kvs[i]);
    }

    // join and rollback
    for (i = 0; i < nf; i++) {
        thread_join(tid_wr[i], &thread_ret_wr[i]);
        status = fdb_rollback(&kvs[i], 7);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

    status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    for (i = 0; i < nf; i++) {
        // verify rollback kvs
        status = fdb_iterator_init(kvs[i], &it, NULL, 0,
                                   NULL, 0, FDB_ITR_NONE);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        j = 0;
        do {
            status = fdb_iterator_get(it, &rdoc);
            TEST_CHK (status == FDB_RESULT_SUCCESS);
            fdb_doc_free(rdoc);
            rdoc=NULL;
            j++;
        } while (fdb_iterator_next(it) != FDB_RESULT_ITERATOR_FAIL);
        TEST_CHK(j==7);
        fdb_iterator_close(it);
    }

    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    fdb_close(dbfile);
    fdb_shutdown();

    memleak_end();

    r = system(SHELL_DEL" e2edb_main > errorlog.txt");
    (void)r;

    TEST_RESULT("TEST: e2e multi kvs concurrent wr test");
}